

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::actionEvent(QToolBar *this,QActionEvent *event)

{
  Type TVar1;
  int iVar2;
  QToolBarPrivate *pQVar3;
  QObject *pQVar4;
  QWidgetActionPrivate *pQVar5;
  QAction *pQVar6;
  long *plVar7;
  QActionEvent *in_RSI;
  QAction *in_RDI;
  int index_1;
  int index;
  QWidgetAction *widgetAction;
  QAction *action;
  QToolBarPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  
  pQVar3 = d_func((QToolBar *)0x6ecec1);
  QActionEvent::action(in_RSI);
  pQVar4 = (QObject *)qobject_cast<QWidgetAction*>((QObject *)0x6ecedf);
  TVar1 = QEvent::type((QEvent *)in_RSI);
  if (TVar1 == ActionChanged) {
    (**(code **)(*(long *)&pQVar3->layout->super_QLayout + 0x70))();
  }
  else if (TVar1 == ActionAdded) {
    if ((pQVar4 != (QObject *)0x0) &&
       (pQVar5 = QWidgetAction::d_func((QWidgetAction *)0x6ecf2e),
       ((byte)pQVar5->field_0x1d0 >> 1 & 1) != 0)) {
      QObject::setParent(pQVar4);
    }
    iVar2 = (int)((ulong)pQVar4 >> 0x20);
    (**(code **)(*(long *)&pQVar3->layout->super_QLayout + 200))();
    pQVar6 = QActionEvent::before(in_RSI);
    if (pQVar6 != (QAction *)0x0) {
      QActionEvent::before(in_RSI);
      QToolBarLayout::indexOf((QToolBarLayout *)CONCAT44(TVar1,in_stack_ffffffffffffffc8),in_RDI);
    }
    QToolBarLayout::insertAction
              ((QToolBarLayout *)CONCAT44(TVar1,in_stack_ffffffffffffffc8),iVar2,in_RDI);
  }
  else if (((TVar1 == ActionRemoved) &&
           (iVar2 = QToolBarLayout::indexOf
                              ((QToolBarLayout *)CONCAT44(0x73,in_stack_ffffffffffffffc8),in_RDI),
           iVar2 != -1)) &&
          (plVar7 = (long *)(**(code **)(*(long *)&pQVar3->layout->super_QLayout + 0xb0))
                                      (pQVar3->layout,iVar2), plVar7 != (long *)0x0)) {
    (**(code **)(*plVar7 + 8))();
  }
  return;
}

Assistant:

void QToolBar::actionEvent(QActionEvent *event)
{
    Q_D(QToolBar);
    auto action = static_cast<QAction *>(event->action());
    QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(action);

    switch (event->type()) {
        case QEvent::ActionAdded: {
            Q_ASSERT_X(widgetAction == nullptr || d->layout->indexOf(widgetAction) == -1,
                        "QToolBar", "widgets cannot be inserted multiple times");

            // reparent the action to this toolbar if it has been created
            // using the addAction(text) etc. convenience functions, to
            // preserve Qt 4.1.x behavior. The widget is already
            // reparented to us due to the createWidget call inside
            // createItem()
            if (widgetAction != nullptr && widgetAction->d_func()->autoCreated)
                widgetAction->setParent(this);

            int index = d->layout->count();
            if (event->before()) {
                index = d->layout->indexOf(event->before());
                Q_ASSERT_X(index != -1, "QToolBar::insertAction", "internal error");
            }
            d->layout->insertAction(index, action);
            break;
        }

        case QEvent::ActionChanged:
            d->layout->invalidate();
            break;

        case QEvent::ActionRemoved: {
            int index = d->layout->indexOf(action);
            if (index != -1) {
                delete d->layout->takeAt(index);
            }
            break;
        }

        default:
            Q_ASSERT_X(false, "QToolBar::actionEvent", "internal error");
    }
}